

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

UConverter *
ucnv_safeClone_63(UConverter *cnv,void *stackBuffer,int32_t *pBufferSize,UErrorCode *status)

{
  UConverterSafeClone p_Var1;
  uint8_t *puVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  UConverter *buffer;
  uint8_t *puVar12;
  UConverter *__s;
  uint uVar13;
  bool bVar14;
  int32_t bufferSizeNeeded;
  int32_t stackBufferSize;
  UErrorCode cbErr;
  UConverterFromUnicodeArgs fromUArgs;
  UConverterToUnicodeArgs toUArgs;
  
  toUArgs.converter = (UConverter *)0x0;
  toUArgs.target = (UChar *)0x0;
  toUArgs.targetLimit = (UChar *)0x0;
  toUArgs.source = (char *)0x0;
  toUArgs.sourceLimit = (char *)0x0;
  toUArgs.offsets = (int32_t *)0x0;
  toUArgs.size = 0x38;
  toUArgs.flush = '\x01';
  toUArgs._3_5_ = 0;
  fromUArgs.converter = (UConverter *)0x0;
  fromUArgs.target = (char *)0x0;
  fromUArgs.targetLimit = (char *)0x0;
  fromUArgs.offsets = (int32_t *)0x0;
  fromUArgs.source = (UChar *)0x0;
  fromUArgs.sourceLimit = (UChar *)0x0;
  fromUArgs.size = 0x38;
  fromUArgs.flush = '\x01';
  fromUArgs._3_5_ = 0;
  if (status == (UErrorCode *)0x0) {
    return (UConverter *)0x0;
  }
  if (U_ZERO_ERROR < *status) {
    return (UConverter *)0x0;
  }
  if (cnv == (UConverter *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return (UConverter *)0x0;
  }
  p_Var1 = cnv->sharedData->impl->safeClone;
  if (p_Var1 == (UConverterSafeClone)0x0) {
    bufferSizeNeeded = 0x120;
  }
  else {
    bufferSizeNeeded = 0;
    (*p_Var1)(cnv,(void *)0x0,&bufferSizeNeeded,status);
    if (U_ZERO_ERROR < *status) {
      return (UConverter *)0x0;
    }
  }
  if (pBufferSize == (int32_t *)0x0) {
    pBufferSize = &stackBufferSize;
    stackBufferSize = 1;
  }
  else {
    stackBufferSize = *pBufferSize;
    if (stackBufferSize < 1) {
      *pBufferSize = bufferSizeNeeded;
      return (UConverter *)0x0;
    }
  }
  if (((ulong)stackBuffer & 7) != 0) {
    uVar13 = 8 - (int)((ulong)stackBuffer & 7);
    bVar14 = (uint)stackBufferSize < uVar13;
    stackBufferSize = stackBufferSize - uVar13;
    if (bVar14 || stackBufferSize == 0) {
      stackBufferSize = 1;
    }
    else {
      stackBuffer = (void *)((long)stackBuffer + (ulong)uVar13);
    }
  }
  if ((UConverter *)stackBuffer == (UConverter *)0x0 || stackBufferSize < bufferSizeNeeded) {
    buffer = (UConverter *)uprv_malloc_63((long)bufferSizeNeeded);
    if (buffer == (UConverter *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (UConverter *)0x0;
    }
    *status = U_SAFECLONE_ALLOCATED_WARNING;
    *pBufferSize = bufferSizeNeeded;
    __s = buffer;
  }
  else {
    buffer = (UConverter *)0x0;
    __s = (UConverter *)stackBuffer;
  }
  memset(__s,0,(long)bufferSizeNeeded);
  memcpy(__s,cnv,0x120);
  __s->isCopyLocal = '\0';
  __s->isExtraLocal = '\0';
  if ((UChar *)cnv->subChars == cnv->subUChars) {
    __s->subChars = (uint8_t *)__s->subUChars;
  }
  else {
    puVar12 = (uint8_t *)uprv_malloc_63(0x40);
    __s->subChars = puVar12;
    if (puVar12 == (uint8_t *)0x0) goto LAB_00300a36;
    puVar2 = cnv->subChars;
    uVar3 = *(undefined4 *)puVar2;
    uVar4 = *(undefined4 *)(puVar2 + 4);
    uVar5 = *(undefined4 *)(puVar2 + 8);
    uVar6 = *(undefined4 *)(puVar2 + 0xc);
    uVar7 = *(undefined8 *)(puVar2 + 0x10);
    uVar8 = *(undefined8 *)(puVar2 + 0x18);
    uVar9 = *(undefined8 *)(puVar2 + 0x20);
    uVar10 = *(undefined8 *)(puVar2 + 0x28);
    uVar11 = *(undefined8 *)(puVar2 + 0x38);
    *(undefined8 *)(puVar12 + 0x30) = *(undefined8 *)(puVar2 + 0x30);
    *(undefined8 *)(puVar12 + 0x38) = uVar11;
    *(undefined8 *)(puVar12 + 0x20) = uVar9;
    *(undefined8 *)(puVar12 + 0x28) = uVar10;
    *(undefined8 *)(puVar12 + 0x10) = uVar7;
    *(undefined8 *)(puVar12 + 0x18) = uVar8;
    *(undefined4 *)puVar12 = uVar3;
    *(undefined4 *)(puVar12 + 4) = uVar4;
    *(undefined4 *)(puVar12 + 8) = uVar5;
    *(undefined4 *)(puVar12 + 0xc) = uVar6;
  }
  p_Var1 = cnv->sharedData->impl->safeClone;
  if (((p_Var1 == (UConverterSafeClone)0x0) ||
      (__s = (*p_Var1)(cnv,__s,pBufferSize,status), __s != (UConverter *)0x0)) &&
     (*status < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (cnv->sharedData->isReferenceCounted != '\0') {
      ucnv_incrementRefCount_63(cnv->sharedData);
    }
    if (__s == (UConverter *)stackBuffer) {
      __s->isCopyLocal = '\x01';
    }
    cbErr = U_ZERO_ERROR;
    fromUArgs.converter = __s;
    toUArgs.converter = __s;
    (*cnv->fromCharErrorBehaviour)(cnv->toUContext,&toUArgs,(char *)0x0,0,UCNV_CLONE,&cbErr);
    cbErr = U_ZERO_ERROR;
    (*cnv->fromUCharErrorBehaviour)(cnv->fromUContext,&fromUArgs,(UChar *)0x0,0,0,UCNV_CLONE,&cbErr)
    ;
    return __s;
  }
  if ((buffer != (UConverter *)0x0) && ((UChar *)buffer->subChars != buffer->subUChars)) {
    uprv_free_63(buffer->subChars);
  }
LAB_00300a36:
  uprv_free_63(buffer);
  return (UConverter *)0x0;
}

Assistant:

U_CAPI UConverter* U_EXPORT2
ucnv_safeClone(const UConverter* cnv, void *stackBuffer, int32_t *pBufferSize, UErrorCode *status)
{
    UConverter *localConverter, *allocatedConverter;
    int32_t stackBufferSize;
    int32_t bufferSizeNeeded;
    char *stackBufferChars = (char *)stackBuffer;
    UErrorCode cbErr;
    UConverterToUnicodeArgs toUArgs = {
        sizeof(UConverterToUnicodeArgs),
            TRUE,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
    };
    UConverterFromUnicodeArgs fromUArgs = {
        sizeof(UConverterFromUnicodeArgs),
            TRUE,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL,
            NULL
    };

    UTRACE_ENTRY_OC(UTRACE_UCNV_CLONE);

    if (status == NULL || U_FAILURE(*status)){
        UTRACE_EXIT_STATUS(status? *status: U_ILLEGAL_ARGUMENT_ERROR);
        return NULL;
    }

    if (cnv == NULL) {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        UTRACE_EXIT_STATUS(*status);
        return NULL;
    }

    UTRACE_DATA3(UTRACE_OPEN_CLOSE, "clone converter %s at %p into stackBuffer %p",
                                    ucnv_getName(cnv, status), cnv, stackBuffer);

    if (cnv->sharedData->impl->safeClone != NULL) {
        /* call the custom safeClone function for sizing */
        bufferSizeNeeded = 0;
        cnv->sharedData->impl->safeClone(cnv, NULL, &bufferSizeNeeded, status);
        if (U_FAILURE(*status)) {
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
    }
    else
    {
        /* inherent sizing */
        bufferSizeNeeded = sizeof(UConverter);
    }

    if (pBufferSize == NULL) {
        stackBufferSize = 1;
        pBufferSize = &stackBufferSize;
    } else {
        stackBufferSize = *pBufferSize;
        if (stackBufferSize <= 0){ /* 'preflighting' request - set needed size into *pBufferSize */
            *pBufferSize = bufferSizeNeeded;
            UTRACE_EXIT_VALUE(bufferSizeNeeded);
            return NULL;
        }
    }


    /* Pointers on 64-bit platforms need to be aligned
     * on a 64-bit boundary in memory.
     */
    if (U_ALIGNMENT_OFFSET(stackBuffer) != 0) {
        int32_t offsetUp = (int32_t)U_ALIGNMENT_OFFSET_UP(stackBufferChars);
        if(stackBufferSize > offsetUp) {
            stackBufferSize -= offsetUp;
            stackBufferChars += offsetUp;
        } else {
            /* prevent using the stack buffer but keep the size > 0 so that we do not just preflight */
            stackBufferSize = 1;
        }
    }

    stackBuffer = (void *)stackBufferChars;
    
    /* Now, see if we must allocate any memory */
    if (stackBufferSize < bufferSizeNeeded || stackBuffer == NULL)
    {
        /* allocate one here...*/
        localConverter = allocatedConverter = (UConverter *) uprv_malloc (bufferSizeNeeded);

        if(localConverter == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
        *status = U_SAFECLONE_ALLOCATED_WARNING;

        /* record the fact that memory was allocated */
        *pBufferSize = bufferSizeNeeded;
    } else {
        /* just use the stack buffer */
        localConverter = (UConverter*) stackBuffer;
        allocatedConverter = NULL;
    }

    uprv_memset(localConverter, 0, bufferSizeNeeded);

    /* Copy initial state */
    uprv_memcpy(localConverter, cnv, sizeof(UConverter));
    localConverter->isCopyLocal = localConverter->isExtraLocal = FALSE;

    /* copy the substitution string */
    if (cnv->subChars == (uint8_t *)cnv->subUChars) {
        localConverter->subChars = (uint8_t *)localConverter->subUChars;
    } else {
        localConverter->subChars = (uint8_t *)uprv_malloc(UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
        if (localConverter->subChars == NULL) {
            uprv_free(allocatedConverter);
            UTRACE_EXIT_STATUS(*status);
            return NULL;
        }
        uprv_memcpy(localConverter->subChars, cnv->subChars, UCNV_ERROR_BUFFER_LENGTH * U_SIZEOF_UCHAR);
    }

    /* now either call the safeclone fcn or not */
    if (cnv->sharedData->impl->safeClone != NULL) {
        /* call the custom safeClone function */
        localConverter = cnv->sharedData->impl->safeClone(cnv, localConverter, pBufferSize, status);
    }

    if(localConverter==NULL || U_FAILURE(*status)) {
        if (allocatedConverter != NULL && allocatedConverter->subChars != (uint8_t *)allocatedConverter->subUChars) {
            uprv_free(allocatedConverter->subChars);
        }
        uprv_free(allocatedConverter);
        UTRACE_EXIT_STATUS(*status);
        return NULL;
    }

    /* increment refcount of shared data if needed */
    if (cnv->sharedData->isReferenceCounted) {
        ucnv_incrementRefCount(cnv->sharedData);
    }

    if(localConverter == (UConverter*)stackBuffer) {
        /* we're using user provided data - set to not destroy */
        localConverter->isCopyLocal = TRUE;
    }

    /* allow callback functions to handle any memory allocation */
    toUArgs.converter = fromUArgs.converter = localConverter;
    cbErr = U_ZERO_ERROR;
    cnv->fromCharErrorBehaviour(cnv->toUContext, &toUArgs, NULL, 0, UCNV_CLONE, &cbErr);
    cbErr = U_ZERO_ERROR;
    cnv->fromUCharErrorBehaviour(cnv->fromUContext, &fromUArgs, NULL, 0, 0, UCNV_CLONE, &cbErr);

    UTRACE_EXIT_PTR_STATUS(localConverter, *status);
    return localConverter;
}